

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O1

uint8_t * vfio_map_region(int vfio_fd,int region_index)

{
  int iVar1;
  uint8_t *puVar2;
  vfio_region_info region_info;
  char buf [512];
  
  iVar1 = ioctl(vfio_fd,0x3b6c);
  if (iVar1 != -1) {
    puVar2 = (uint8_t *)mmap((void *)0x0,0,3,1,vfio_fd,0);
    if (puVar2 != (uint8_t *)0xffffffffffffffff) {
      return puVar2;
    }
    vfio_map_region_cold_1();
  }
  return (uint8_t *)0xffffffffffffffff;
}

Assistant:

uint8_t* vfio_map_region(int vfio_fd, int region_index) {
	struct vfio_region_info region_info = {.argsz = sizeof(region_info)};
	region_info.index = region_index;
	int ret = ioctl(vfio_fd, VFIO_DEVICE_GET_REGION_INFO, &region_info);
	if (ret == -1) {
		// Failed to set iommu type
		return MAP_FAILED; // MAP_FAILED == ((void *) -1)
	}
	return (uint8_t*) check_err(mmap(NULL, region_info.size, PROT_READ | PROT_WRITE, MAP_SHARED, vfio_fd, region_info.offset), "mmap vfio bar0 resource");
}